

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall
caffe::EltwiseParameter::EltwiseParameter(EltwiseParameter *this,EltwiseParameter *from)

{
  void *pvVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EltwiseParameter_007607e0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->coeff_,&from->coeff_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->stable_prod_grad_ = from->stable_prod_grad_;
  this->operation_ = from->operation_;
  return;
}

Assistant:

EltwiseParameter::EltwiseParameter(const EltwiseParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      coeff_(from.coeff_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&operation_, &from.operation_,
    reinterpret_cast<char*>(&stable_prod_grad_) -
    reinterpret_cast<char*>(&operation_) + sizeof(stable_prod_grad_));
  // @@protoc_insertion_point(copy_constructor:caffe.EltwiseParameter)
}